

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

bool libtorrent::aux::is_i2p_url(string *url)

{
  bool bVar1;
  error_code *in_R8;
  string_view url_00;
  string_view local_130;
  string_view local_120;
  tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
  local_110 [56];
  undefined1 local_d8 [16];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined1 local_40 [8];
  error_code ec;
  string hostname;
  string *url_local;
  
  ::std::__cxx11::string::string((string *)&ec.cat_);
  boost::system::error_code::error_code((error_code *)local_40);
  local_d8 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)url);
  url_00._M_len = local_d8._8_8_;
  url_00._M_str = (char *)local_40;
  parse_url_components_abi_cxx11_(&local_c8,local_d8._0_8_,url_00,in_R8);
  ::std::
  tie<std::_Swallow_assign_const,std::_Swallow_assign_const,std::__cxx11::string,std::_Swallow_assign_const,std::_Swallow_assign_const>
            ((tuple<const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&>
              *)local_110,(_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec.cat_,
             (_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore);
  ::std::
  tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
  ::operator=(local_110,
              (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_c8);
  ::std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_c8);
  local_120 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ec.cat_);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_130,".i2p");
  bVar1 = string_ends_with(local_120,local_130);
  ::std::__cxx11::string::~string((string *)&ec.cat_);
  return bVar1;
}

Assistant:

bool is_i2p_url(std::string const& url)
	{
		using std::ignore;
		std::string hostname;
		error_code ec;
		std::tie(ignore, ignore, hostname, ignore, ignore)
			= parse_url_components(url, ec);
		return string_ends_with(hostname, ".i2p");
	}